

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O2

void __thiscall
data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
_checkN(PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this,size_t n)

{
  out_of_range *this_00;
  
  if (n - 1 < (this->_list)._size) {
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range
            (this_00,"N must be larger than 0 and less than this queue\'s size !");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

inline
    void PriorityQueue<T>::_checkN(const size_t n) {
        auto size = _list.size();
        if (n == 0 || n > size) {
            throw std::out_of_range("N must be larger than 0 and less than this queue's size !");
        }
    }